

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O0

void compute_ui_entry_values_for_player
               (ui_entry *entry,player *p,cached_player_data **cache,wchar_t *val,wchar_t *auxval)

{
  loc_conflict grid;
  _Bool _Var1;
  int iVar2;
  wchar_t wVar3;
  cached_player_data *pcVar4;
  object *poVar5;
  ui_entry_combiner_state_conflict *extraout_RDX;
  ui_entry_combiner_state_conflict *extraout_RDX_00;
  ui_entry_combiner_state_conflict *extraout_RDX_01;
  ui_entry_combiner_state_conflict *extraout_RDX_02;
  ui_entry_combiner_state_conflict *extraout_RDX_03;
  ui_entry_combiner_state_conflict *extraout_RDX_04;
  ui_entry_combiner_state_conflict *extraout_RDX_05;
  ui_entry_combiner_state_conflict *extraout_RDX_06;
  ui_entry_combiner_state_conflict *extraout_RDX_07;
  ui_entry_combiner_state_conflict *extraout_RDX_08;
  ui_entry_combiner_state_conflict *extraout_RDX_09;
  ui_entry_combiner_state_conflict *extraout_RDX_10;
  ui_entry_combiner_state_conflict *extraout_RDX_11;
  ui_entry_combiner_state_conflict *extraout_RDX_12;
  ui_entry_combiner_state_conflict *extraout_RDX_13;
  ui_entry_combiner_state_conflict *extraout_RDX_14;
  ui_entry_combiner_state_conflict *extraout_RDX_15;
  ui_entry_combiner_state_conflict *extraout_RDX_16;
  ui_entry_combiner_state_conflict *extraout_RDX_17;
  undefined8 extraout_RDX_18;
  ui_entry_combiner_state_conflict *puVar6;
  ui_entry_combiner_state_conflict *extraout_RDX_19;
  ui_entry_combiner_state_conflict *extraout_RDX_20;
  ui_entry_combiner_state_conflict *extraout_RDX_21;
  ui_entry_combiner_state_conflict *extraout_RDX_22;
  ui_entry_combiner_state_conflict *extraout_RDX_23;
  ui_entry_combiner_state_conflict *extraout_RDX_24;
  ui_entry_combiner_state_conflict *extraout_RDX_25;
  ui_entry_combiner_state_conflict *extraout_RDX_26;
  ui_entry_combiner_state_conflict *extraout_RDX_27;
  char *funcs;
  wchar_t local_fc;
  wchar_t t_14;
  wchar_t t_13;
  wchar_t t_12;
  wchar_t a_4;
  wchar_t v_4;
  wchar_t skill_cnv_den;
  wchar_t skill_cnv_num;
  wchar_t skill_ind;
  wchar_t ind_1;
  wchar_t t_11;
  wchar_t t_10;
  wchar_t base;
  wchar_t a_3;
  wchar_t v_3;
  wchar_t t_9;
  wchar_t t_8;
  wchar_t a_2;
  wchar_t v_2;
  wchar_t t_7;
  wchar_t t_6;
  wchar_t t_5;
  wchar_t t_4;
  wchar_t t_3;
  wchar_t t_2;
  wchar_t t_1;
  object *launcher;
  wchar_t a_1;
  wchar_t v_1;
  wchar_t t;
  wchar_t a;
  wchar_t v;
  wchar_t ind;
  wchar_t i;
  _Bool element_done;
  _Bool first;
  ui_entry_combiner_funcs_conflict1 combiner;
  ui_entry_combiner_state_conflict cst;
  wchar_t *auxval_local;
  wchar_t *val_local;
  cached_player_data **cache_local;
  player *p_local;
  ui_entry *entry_local;
  
  memset(&combiner.vec_func,0,0x10);
  ind._2_1_ = 0;
  if (p == (player *)0x0) {
    *val = L'\x7ffffffe';
    *auxval = L'\x7ffffffe';
  }
  else {
    if (*cache == (cached_player_data *)0x0) {
      pcVar4 = (cached_player_data *)mem_alloc(0xc);
      *cache = pcVar4;
      player_flags(p,(*cache)->untimed);
      flag_wipe((*cache)->timed,6);
      player_flags_timed(p,(*cache)->timed);
      if (p->timed[0x20] != 0) {
        flag_on_dbg((*cache)->timed,6,0x28,"(*cache)->timed","OF_TRAP_IMMUNE");
      }
    }
    ind._3_1_ = 1;
    funcs = (char *)&i;
    iVar2 = ui_entry_combiner_get_funcs(entry->combiner_index,(ui_entry_combiner_funcs *)funcs);
    if (iVar2 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-entry.c"
                    ,0x375,
                    "void compute_ui_entry_values_for_player(const struct ui_entry *, struct player *, struct cached_player_data **, int *, int *)"
                   );
    }
    puVar6 = extraout_RDX;
    for (v = L'\0'; v < entry->n_p_ability; v = v + L'\x01') {
      a = (wchar_t)(entry->p_abilities[v].ability)->index;
      if (((entry->flags & 1U) == 0) || ((entry->p_abilities[v].isaux & 1U) == 0)) {
        iVar2 = strcmp((entry->p_abilities[v].ability)->type,"player");
        if (iVar2 == 0) {
          funcs = (char *)0xa;
          _Var1 = flag_has_dbg((p->state).pflags,10,a,"p->state.pflags","(ind)");
          puVar6 = extraout_RDX_00;
          if (_Var1) {
            if ((entry->p_abilities[v].have_value & 1U) == 0) {
              switch(a) {
              case L'\x12':
                funcs = (char *)0x1e;
                _Var1 = player_of_has(p,L'\x1e');
                puVar6 = extraout_RDX_11;
                if (_Var1) {
                  launcher._4_4_ = L'\xfffffffd';
                  launcher._0_4_ = L'\0';
                  if ((entry->p_abilities[v].isaux & 1U) != 0) {
                    t_7 = L'\xfffffffd';
                    launcher._4_4_ = L'\0';
                    launcher._0_4_ = L'\xfffffffd';
                  }
                  if ((ind._3_1_ & 1) == 0) {
                    funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                    (*combiner.init_func)
                              (launcher._4_4_,(wchar_t)launcher,
                               (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                    puVar6 = extraout_RDX_13;
                  }
                  else {
                    funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                    (*_i)(launcher._4_4_,(wchar_t)launcher,
                          (ui_entry_combiner_state *)&combiner.vec_func);
                    ind._3_1_ = 0;
                    puVar6 = extraout_RDX_12;
                  }
                }
                break;
              case L'\x13':
                wVar3 = slot_by_name(p,"weapon");
                poVar5 = slot_object(p,wVar3);
                if (poVar5 == (object *)0x0) {
                  launcher._4_4_ = (int)p->lev / 2;
                }
                else {
                  launcher._4_4_ = L'\0';
                }
                wVar3 = launcher._4_4_;
                launcher._0_4_ = L'\0';
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  v_2 = launcher._4_4_;
                  launcher._4_4_ = L'\0';
                  launcher._0_4_ = wVar3;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_15;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_14;
                }
                break;
              case L'\x19':
                wVar3 = (wchar_t)(0x1d < p->lev);
                launcher._0_4_ = L'\0';
                launcher._4_4_ = wVar3;
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  launcher._4_4_ = L'\0';
                  t_4 = wVar3;
                  launcher._0_4_ = wVar3;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_06;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_05;
                }
                break;
              case L'%':
                _t_2 = equipped_item_by_slot_name(p,"shooting");
                if ((_t_2 == (object *)0x0) ||
                   (_Var1 = flag_has_dbg(_t_2->kind->kind_flags,4,0x19,"launcher->kind->kind_flags",
                                         "KF_SHOOTS_ARROWS"), !_Var1)) {
                  launcher._4_4_ = L'\0';
                }
                else {
                  launcher._4_4_ = (int)p->lev / 3;
                }
                wVar3 = launcher._4_4_;
                launcher._0_4_ = L'\0';
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  t_3 = launcher._4_4_;
                  launcher._4_4_ = L'\0';
                  launcher._0_4_ = wVar3;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_04;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_03;
                }
                break;
              case L'.':
                if (((0x23 < p->lev) &&
                    (_Var1 = flag_has_dbg((p->state).pflags,10,0x2d,"p->state.pflags",
                                          "(PF_STRONG_MAGIC)"), _Var1)) || (0x2d < p->lev)) {
                  launcher._4_4_ = L'\x01';
                }
                else {
                  launcher._4_4_ = L'\0';
                }
                wVar3 = launcher._4_4_;
                launcher._0_4_ = L'\0';
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  t_6 = launcher._4_4_;
                  launcher._4_4_ = L'\0';
                  launcher._0_4_ = wVar3;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_10;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_09;
                }
                break;
              case L'0':
                if ((((character_dungeon & 1U) == 0) ||
                    (_Var1 = flag_has_dbg((p->state).pflags,10,0x16,"p->state.pflags","(PF_ELVEN)"),
                    !_Var1)) ||
                   (grid.x = (p->grid).x, grid.y = (p->grid).y,
                   _Var1 = square_istree((chunk *)cave,grid), !_Var1)) {
                  launcher._4_4_ = L'\0';
                }
                else {
                  launcher._4_4_ = L'\x03';
                }
                wVar3 = launcher._4_4_;
                launcher._0_4_ = L'\0';
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  a_2 = launcher._4_4_;
                  launcher._4_4_ = L'\0';
                  launcher._0_4_ = wVar3;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_17;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_16;
                }
                break;
              case L'7':
              case L'J':
                if (p->speed_boost == 0) {
                  local_fc = L'\0';
                }
                else {
                  local_fc = (p->speed_boost + 5) / 10;
                }
                launcher._4_4_ = local_fc;
                launcher._0_4_ = L'\0';
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  t_5 = local_fc;
                  launcher._4_4_ = L'\0';
                  launcher._0_4_ = local_fc;
                }
                if ((ind._3_1_ & 1) == 0) {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*combiner.init_func)
                            (launcher._4_4_,(wchar_t)launcher,
                             (ui_entry_combiner_state_conflict *)&combiner.vec_func);
                  puVar6 = extraout_RDX_08;
                }
                else {
                  funcs = (char *)(ulong)(uint)(wchar_t)launcher;
                  (*_i)(launcher._4_4_,(wchar_t)launcher,
                        (ui_entry_combiner_state *)&combiner.vec_func);
                  ind._3_1_ = 0;
                  puVar6 = extraout_RDX_07;
                }
              }
            }
            else {
              wVar3 = entry->p_abilities[v].value;
              v_1 = L'\x7ffffffe';
              t = wVar3;
              if ((entry->p_abilities[v].isaux & 1U) != 0) {
                t = L'\x7ffffffe';
                a_1 = wVar3;
                v_1 = wVar3;
              }
              if ((ind._3_1_ & 1) == 0) {
                funcs = (char *)(ulong)(uint)v_1;
                (*combiner.init_func)(t,v_1,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar6 = extraout_RDX_02;
              }
              else {
                funcs = (char *)(ulong)(uint)v_1;
                (*_i)(t,v_1,(ui_entry_combiner_state *)&combiner.vec_func);
                ind._3_1_ = 0;
                puVar6 = extraout_RDX_01;
              }
            }
          }
        }
        else {
          iVar2 = strcmp((entry->p_abilities[v].ability)->type,"object");
          if (iVar2 == 0) {
            _Var1 = flag_has_dbg((*cache)->untimed,6,a,"(*cache)->untimed","ind");
            t_8 = (wchar_t)_Var1;
            if ((entry->flags & 1U) == 0) {
              t_9 = L'\0';
            }
            else {
              _Var1 = flag_has_dbg((*cache)->timed,6,a,"(*cache)->timed","ind");
              t_9 = (wchar_t)_Var1;
            }
            wVar3 = t_8;
            if ((entry->p_abilities[v].isaux & 1U) != 0) {
              v_3 = t_8;
              t_8 = t_9;
              t_9 = wVar3;
            }
            if ((ind._3_1_ & 1) == 0) {
              (*combiner.init_func)(t_8,t_9,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
            }
            else {
              (*_i)(t_8,t_9,(ui_entry_combiner_state *)&combiner.vec_func);
              ind._3_1_ = 0;
            }
            funcs = (char *)0x6;
            _Var1 = flag_has_dbg(p->shape->flags,6,a,"p->shape->flags","ind");
            puVar6 = (ui_entry_combiner_state_conflict *)
                     CONCAT71((int7)((ulong)extraout_RDX_18 >> 8),_Var1);
            t_8 = (wchar_t)_Var1;
            t_9 = L'\0';
            if (t_8 != L'\0') {
              funcs = (char *)0x6;
              _Var1 = flag_has_dbg(p->obj_k->flags,6,a,"p->obj_k->flags","ind");
              wVar3 = t_8;
              puVar6 = extraout_RDX_19;
              if (_Var1) {
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  a_3 = t_8;
                  t_8 = t_9;
                  t_9 = wVar3;
                }
                funcs = (char *)(ulong)(uint)t_9;
                (*combiner.init_func)
                          (t_8,t_9,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar6 = extraout_RDX_20;
              }
            }
          }
          else {
            funcs = "element";
            iVar2 = strcmp((entry->p_abilities[v].ability)->type,"element");
            puVar6 = extraout_RDX_21;
            if ((iVar2 == 0) && ((ind._2_1_ & 1) == 0)) {
              base = (wchar_t)p->race->el_info[a].res_level;
              t_11 = L'd';
              if ((entry->flags & 1U) == 0) {
                t_10 = L'd';
              }
              else {
                t_10 = get_timed_element_effect(p,a);
              }
              wVar3 = base;
              if ((entry->p_abilities[v].isaux & 1U) != 0) {
                ind_1 = base;
                base = t_10;
                t_10 = wVar3;
              }
              if ((ind._3_1_ & 1) == 0) {
                funcs = (char *)(ulong)(uint)t_10;
                (*combiner.init_func)
                          (base,t_10,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar6 = extraout_RDX_23;
              }
              else {
                funcs = (char *)(ulong)(uint)t_10;
                (*_i)(base,t_10,(ui_entry_combiner_state *)&combiner.vec_func);
                ind._3_1_ = 0;
                puVar6 = extraout_RDX_22;
              }
              wVar3 = (wchar_t)p->shape->el_info[a].res_level;
              t_10 = t_11;
              base = wVar3;
              if ((wVar3 != t_11) && (p->obj_k->el_info[a].res_level != 0)) {
                if ((entry->p_abilities[v].isaux & 1U) != 0) {
                  base = t_11;
                  skill_ind = wVar3;
                  t_10 = wVar3;
                }
                funcs = (char *)(ulong)(uint)t_10;
                (*combiner.init_func)
                          (base,t_10,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
                puVar6 = extraout_RDX_24;
              }
              ind._2_1_ = 1;
            }
          }
        }
      }
    }
    for (v = L'\0'; v < entry->n_obj_prop; v = v + L'\x01') {
      skill_cnv_num = entry->obj_props[v].index;
      if ((((entry->obj_props[v].isaux & 1U) == 0) || ((entry->flags & 1U) == 0)) &&
         (wVar3 = entry->obj_props[v].type, wVar3 == L'\x01' || wVar3 == L'\x02')) {
        wVar3 = (wchar_t)p->shape->modifiers[skill_cnv_num];
        if ((entry->flags & 1U) == 0) {
          t_13 = L'\0';
        }
        else {
          t_13 = get_timed_modifier_effect(p,skill_cnv_num);
        }
        t_12 = wVar3;
        if ((entry->obj_props[v].isaux & 1U) != 0) {
          t_12 = t_13;
          t_13 = wVar3;
        }
        if ((ind._3_1_ & 1) == 0) {
          (*combiner.init_func)(t_12,t_13,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
        }
        else {
          (*_i)(t_12,t_13,(ui_entry_combiner_state *)&combiner.vec_func);
          ind._3_1_ = 0;
        }
        funcs = (char *)&skill_cnv_den;
        modifier_to_skill(skill_cnv_num,(wchar_t *)funcs,&v_4,&a_4);
        puVar6 = extraout_RDX_25;
        if (L'\xffffffff' < skill_cnv_den) {
          wVar3 = (p->race->r_skills[skill_cnv_den] * v_4) / a_4;
          t_13 = L'\0';
          t_12 = wVar3;
          if ((entry->obj_props[v].isaux & 1U) != 0) {
            t_12 = L'\0';
            t_13 = wVar3;
          }
          funcs = (char *)(ulong)(uint)t_13;
          (*combiner.init_func)(t_12,t_13,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
          puVar6 = extraout_RDX_26;
        }
        if (skill_cnv_num == L'\a') {
          wVar3 = p->race->infra;
          t_13 = L'\0';
          t_12 = wVar3;
          if ((entry->obj_props[v].isaux & 1U) != 0) {
            t_12 = L'\0';
            t_13 = wVar3;
          }
          funcs = (char *)(ulong)(uint)t_13;
          (*combiner.init_func)(t_12,t_13,(ui_entry_combiner_state_conflict *)&combiner.vec_func);
          puVar6 = extraout_RDX_27;
        }
      }
    }
    if ((ind._3_1_ & 1) == 0) {
      (*combiner.accum_func)((int)&combiner + L'\x18',(wchar_t)funcs,puVar6);
      *val = (wchar_t)cst.work;
      *auxval = cst.work._4_4_;
    }
    else {
      *val = L'\x7ffffffe';
      *auxval = L'\x7ffffffe';
    }
  }
  return;
}

Assistant:

void compute_ui_entry_values_for_player(const struct ui_entry *entry,
	struct player *p, struct cached_player_data **cache, int *val,
	int *auxval)
{
	struct ui_entry_combiner_state cst = { 0, 0, 0 };
	struct ui_entry_combiner_funcs combiner;
	bool first, element_done = false;
	int i;

	if (!p) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
		return;
	}
	if (*cache == NULL) {
		*cache = mem_alloc(sizeof(**cache));
		player_flags(p, (*cache)->untimed);
		of_wipe((*cache)->timed);
		player_flags_timed(p, (*cache)->timed);
		if (p->timed[TMD_TRAPSAFE]) {
			of_on((*cache)->timed, OF_TRAP_IMMUNE);
		}
	}
	first = true;
	if (ui_entry_combiner_get_funcs(entry->combiner_index, &combiner)) {
		assert(0);
	}
	for (i = 0; i < entry->n_p_ability; ++i) {
		int ind = entry->p_abilities[i].ability->index;

		if ((entry->flags & ENTRY_FLAG_TIMED_AUX) &&
			entry->p_abilities[i].isaux) {
			continue;
		}
		if (streq(entry->p_abilities[i].ability->type, "player")) {
			if (! player_has(p, ind)) {
				continue;
			}
			if (entry->p_abilities[i].have_value) {
				int v = entry->p_abilities[i].value;
				int a = UI_ENTRY_VALUE_NOT_PRESENT;

				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				if (first) {
					(*combiner.init_func)(v, a, &cst);
					first = false;
				} else {
					(*combiner.accum_func)(v, a, &cst);
				}
			} else {
				int v, a;
				struct object *launcher;

				/*
				 * Handle player abilities that did not bind a
				 * value to the user interface element as
				 * special cases.
				 */
				switch (ind) {
				case PF_BOW_SPEED_GREAT:
					launcher = equipped_item_by_slot_name(
						p, "shooting");
					if (launcher && kf_has(launcher->kind->kind_flags,
						KF_SHOOTS_ARROWS)) {
						v = p->lev / 3;
						a = 0;
					} else {
						v = 0;
						a = 0;
					}
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_BRAVERY_30:
					/*
					 * player_flags() accounts for
					 * PF_BRAVERY_30 so this is only
					 * necessary in cases where
					 * OF_PROT_FEAR isn't also bound to
					 * the element.
					 */
					v = (p->lev >= 30) ? 1 : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_FURY:
				case PF_PHASEWALK:
					v = (p->speed_boost) ?
						 ((p->speed_boost + 5) / 10) : 0;
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_HOLY:
					if ((p->lev > 35 &&
						player_has(p, PF_STRONG_MAGIC)) ||
						p->lev > 45) {
						v = 1;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_SHADOW:
					if (player_of_has(p, OF_AGGRAVATE)) {
						v = -3;
						a = 0;
						if (entry->p_abilities[i].isaux) {
							int t = v;

							v = a;
							a = t;
						}
						if (first) {
							(*combiner.init_func)(v, a, &cst);
							first = false;
						} else {
							(*combiner.accum_func)(v, a, &cst);
						}
					};
					break;

				case PF_WOODEN:
					/* Account for unarmed digging bonus. */
					if (! slot_object(p, slot_by_name(p, "weapon"))) {
						v = p->lev / 2;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;

				case PF_WOODSMAN:
					if (character_dungeon &&
						player_has(p, PF_ELVEN) &&
						square_istree(cave, p->grid)) {
						v = 3;
					} else {
						v = 0;
					}
					a = 0;
					if (entry->p_abilities[i].isaux) {
						int t = v;

						v = a;
						a = t;
					}
					if (first) {
						(*combiner.init_func)(v, a, &cst);
						first = false;
					} else {
						(*combiner.accum_func)(v, a, &cst);
					}
					break;
				}
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"object")) {
			int v = of_has((*cache)->untimed, ind) ? 1 : 0;
			int a;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = of_has((*cache)->timed, ind) ? 1 : 0;
			} else {
				a = 0;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}

			v = of_has(p->shape->flags, ind) ? 1 : 0;
			a = 0;
			if (v && of_has(p->obj_k->flags, ind)) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
		} else if (streq(entry->p_abilities[i].ability->type,
			"element") && !element_done) {
			int v = p->race->el_info[ind].res_level;
			int a;
			int base = RES_LEVEL_BASE;

			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_element_effect(p, ind);
			} else {
				a = base;
			}
			if (entry->p_abilities[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			v = p->shape->el_info[ind].res_level;
			a = base;
			if (v != base && p->obj_k->el_info[ind].res_level) {
				if (entry->p_abilities[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			element_done = true;
		}
	}
	/*
	 * Since stats and modifiers aren't stored in the ability list, check
	 * if any object properties for those are bound to this element.
	 * Then lookup the player's intrinsic values for those.
	 */
	for (i = 0; i < entry->n_obj_prop; ++i) {
		int ind = entry->obj_props[i].index;
		int skill_ind, skill_cnv_num, skill_cnv_den;
		int v, a;

		if (entry->obj_props[i].isaux &&
			(entry->flags & ENTRY_FLAG_TIMED_AUX)) {
			continue;
		}
		switch (entry->obj_props[i].type) {
		case OBJ_PROPERTY_STAT:
		case OBJ_PROPERTY_MOD:
			v = p->shape->modifiers[ind];
			if (entry->flags & ENTRY_FLAG_TIMED_AUX) {
				a = get_timed_modifier_effect(p, ind);
			} else {
				a = 0;
			}
			if (entry->obj_props[i].isaux) {
				int t = v;

				v = a;
				a = t;
			}
			if (first) {
				(*combiner.init_func)(v, a, &cst);
				first = false;
			} else {
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Racial information doesn't store modifiers but does
			 * store skills.  If applicable, extract the relevant
			 * value and convert.
			 */
			modifier_to_skill(ind, &skill_ind, &skill_cnv_num,
				&skill_cnv_den);
			if (skill_ind >= 0) {
				v = (p->race->r_skills[skill_ind] *
					skill_cnv_num) / skill_cnv_den;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			/*
			 * Uggh, the player race handles infravision
			 * separately.
			 */
			if (ind == OBJ_MOD_INFRA) {
				v = p->race->infra;
				a = 0;
				if (entry->obj_props[i].isaux) {
					int t = v;

					v = a;
					a = t;
				}
				(*combiner.accum_func)(v, a, &cst);
			}
			break;
		}
	}
	if (first) {
		*val = UI_ENTRY_VALUE_NOT_PRESENT;
		*auxval = UI_ENTRY_VALUE_NOT_PRESENT;
	} else {
		(*combiner.finish_func)(&cst);
		*val = cst.accum;
		*auxval = cst.accum_aux;
	}
}